

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

_array * garray_getarray_floatonly(_garray *x,int *yonsetp,int *elemsizep)

{
  int iVar1;
  _array *p_Var2;
  t_template *x_00;
  t_symbol *name;
  _array *p_Var3;
  int type;
  int yonset;
  t_symbol *arraytype;
  int local_30;
  int local_2c;
  t_symbol *local_28;
  
  p_Var2 = garray_getarray(x);
  x_00 = template_findbyname(p_Var2->a_templatesym);
  name = gensym("y");
  iVar1 = template_find_field(x_00,name,&local_2c,&local_30,&local_28);
  p_Var3 = (_array *)0x0;
  if ((iVar1 != 0) && (local_30 == 0)) {
    *yonsetp = local_2c;
    *elemsizep = p_Var2->a_elemsize;
    p_Var3 = p_Var2;
  }
  return p_Var3;
}

Assistant:

static t_array *garray_getarray_floatonly(t_garray *x,
    int *yonsetp, int *elemsizep)
{
    t_array *a = garray_getarray(x);
    int yonset, type;
    t_symbol *arraytype;
    t_template *template = template_findbyname(a->a_templatesym);
    if (!template_find_field(template, gensym("y"), &yonset,
        &type, &arraytype) || type != DT_FLOAT)
            return (0);
    *yonsetp = yonset;
    *elemsizep = a->a_elemsize;
    return (a);
}